

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

string * __thiscall
slang::SVInt::toString_abi_cxx11_
          (string *__return_storage_ptr__,SVInt *this,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  SmallVector<char,_40UL> buffer;
  SmallVectorBase<char> local_50 [2];
  
  local_50[0].len = 0;
  local_50[0].cap = 0x28;
  local_50[0].data_ = local_50[0].firstElement;
  writeTo(this,local_50,base,includeBase,abbreviateThresholdBits);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_50[0].data_,local_50[0].data_ + local_50[0].len)
  ;
  if (local_50[0].data_ != local_50[0].firstElement) {
    operator_delete(local_50[0].data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SVInt::toString(LiteralBase base, bool includeBase,
                            bitwidth_t abbreviateThresholdBits) const {
    SmallVector<char> buffer;
    writeTo(buffer, base, includeBase, abbreviateThresholdBits);
    return std::string(buffer.begin(), buffer.end());
}